

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Keno::generate20Numbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Keno *this)

{
  int iVar1;
  time_t tVar2;
  __node_base *p_Var3;
  int iVar4;
  bool bVar5;
  int currNumber;
  Keno_HotAndCold info;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> rand20NumsSet;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rand20NumsSet._M_h._M_buckets = &rand20NumsSet._M_h._M_single_bucket;
  rand20NumsSet._M_h._M_bucket_count = 1;
  p_Var3 = &rand20NumsSet._M_h._M_before_begin;
  rand20NumsSet._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  rand20NumsSet._M_h._M_element_count = 0;
  rand20NumsSet._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  rand20NumsSet._M_h._M_rehash_policy._M_next_resize = 0;
  rand20NumsSet._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar4 = 0x14;
  while( true ) {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) break;
    iVar1 = rand();
    currNumber = iVar1 % 0x50 + 1;
    std::__detail::
    _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&rand20NumsSet,&currNumber);
  }
  if (rand20NumsSet._M_h._M_element_count < 0x14) {
    while (rand20NumsSet._M_h._M_element_count < 0x14) {
      iVar4 = rand();
      currNumber = iVar4 % 0x50 + 1;
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&rand20NumsSet,&currNumber);
    }
  }
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict2 *)(p_Var3 + 1));
  }
  Keno_HotAndCold::Keno_HotAndCold(&info);
  Keno_HotAndCold::infoHotAndCold(&info,__return_storage_ptr__);
  Keno_HotAndCold::~Keno_HotAndCold(&info);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&rand20NumsSet._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Keno::generate20Numbers() {
	srand(time(0));
	std::vector<int> rand20Nums;
	std::unordered_set<int> rand20NumsSet;
	int currNumber;
	int last = 80;
	int first = 1;
	int const maxNumbers =20;
	//int currNumberSet;
	for (int i = 0; i < maxNumbers; ++i) {
		currNumber = rand() % (last + 1 - first) + first;
		rand20NumsSet.insert(currNumber);
	}
	if (rand20NumsSet.size() < maxNumbers) {
		while (rand20NumsSet.size() < maxNumbers) {
			currNumber = rand() % (last + 1 - first) + first;
			rand20NumsSet.insert(currNumber);
		}
	}
	
		for (auto it = rand20NumsSet.begin(); it != rand20NumsSet.end(); ++it) {
			rand20Nums.push_back(*it);
		}
	
	Keno_HotAndCold info;
	info.infoHotAndCold(rand20Nums);
	return rand20Nums;
}